

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cport.cc
# Opt level: O1

void __thiscall rcg::CPort::Write(CPort *this,void *buffer,int64_t addr,int64_t length)

{
  GC_ERROR GVar1;
  ostream *poVar2;
  GenTLException *pGVar3;
  size_t size;
  ostringstream out;
  size_t local_1c8;
  string local_1c0;
  string local_1a0 [11];
  
  local_1c8 = length;
  if (*this->port == (PORT_HANDLE)0x0) {
    pGVar3 = (GenTLException *)__cxa_allocate_exception(0x28);
    local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"CPort::Write(): Port has been closed","");
    GenTLException::GenTLException(pGVar3,local_1a0);
    __cxa_throw(pGVar3,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  GVar1 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->GCWritePort)(*this->port,addr,buffer,&local_1c8);
  if (GVar1 == 0) {
    if (local_1c8 == length) {
      return;
    }
    pGVar3 = (GenTLException *)__cxa_allocate_exception(0x28);
    local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"CPort::Write(): Returned size not as expected","");
    GenTLException::GenTLException(pGVar3,local_1a0);
    __cxa_throw(pGVar3,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"CPort::Write(address=0x",0x17);
  *(uint *)((long)&local_1a0[0].field_2 + *(long *)(local_1a0[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_1a0[0].field_2 + *(long *)(local_1a0[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  poVar2 = std::ostream::_M_insert<long>((long)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", length=",9);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  pGVar3 = (GenTLException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  GenTLException::GenTLException(pGVar3,&local_1c0,&this->gentl);
  __cxa_throw(pGVar3,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

void CPort::Write(const void *buffer, int64_t addr, int64_t length)
{
  size_t size=static_cast<size_t>(length);

  if (*port != 0)
  {
    if (gentl->GCWritePort(*port, static_cast<uint64_t>(addr), buffer, &size) !=
        GenTL::GC_ERR_SUCCESS)
    {
      std::ostringstream out;
      out << "CPort::Write(address=0x" << std::hex << addr << ", length=" <<
        std::dec << length << ")";

      throw GenTLException(out.str(), gentl);
    }

    if (size != static_cast<size_t>(length))
    {
      throw GenTLException("CPort::Write(): Returned size not as expected");
    }
  }
  else
  {
    throw GenTLException("CPort::Write(): Port has been closed");
  }
}